

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O3

uLong cm_zlib_crc32_z(unsigned_long crc,uchar *buf,z_size_t len)

{
  byte *pbVar1;
  uint uVar2;
  uchar *puVar3;
  ulong uVar4;
  byte bVar5;
  ulong *puVar6;
  z_crc_t zVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uLong uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  z_size_t zVar20;
  long lVar21;
  
  if (buf == (uchar *)0x0) {
    uVar13 = 0;
  }
  else {
    uVar10 = crc & 0xffffffff ^ 0xffffffff;
    if (0x2e < len) {
      if (((ulong)buf & 7) != 0) {
        puVar3 = buf + 1;
        zVar20 = len;
        do {
          len = zVar20 - 1;
          uVar18 = *(ulong *)buf;
          buf = (uchar *)((long)buf + 1);
          uVar10 = (ulong)crc_table[(byte)((byte)uVar10 ^ (byte)uVar18)] ^ uVar10 >> 8;
          if (zVar20 == 1) break;
          uVar18 = (ulong)puVar3 & 7;
          puVar3 = puVar3 + 1;
          zVar20 = len;
        } while (uVar18 != 0);
      }
      uVar9 = (uint)uVar10;
      uVar18 = 0;
      lVar14 = len / 0x28 - 1;
      if (lVar14 == 0) {
        uVar12 = 0;
        uVar4 = 0;
        uVar10 = 0;
      }
      else {
        zVar7 = 0;
        uVar12 = 0;
        uVar4 = uVar18;
        puVar6 = (ulong *)buf;
        uVar18 = 0;
        do {
          uVar11 = uVar10 ^ *puVar6;
          uVar17 = uVar12 ^ puVar6[1];
          uVar8 = uVar18 ^ puVar6[2];
          uVar15 = (ulong)zVar7;
          uVar19 = uVar4 ^ puVar6[4];
          uVar10 = (ulong)crc_braid_table[0][(uint)uVar11 & 0xff];
          uVar12 = (ulong)crc_braid_table[0][(uint)uVar17 & 0xff];
          uVar18 = (ulong)crc_braid_table[0][(uint)uVar8 & 0xff];
          zVar7 = crc_braid_table[0][(uint)(uVar15 ^ puVar6[3]) & 0xff];
          uVar4 = (ulong)crc_braid_table[0][(uint)uVar19 & 0xff];
          bVar5 = 8;
          lVar21 = 0;
          do {
            uVar9 = (uint)uVar10 ^
                    *(uint *)(lVar21 + (ulong)((uint)(uVar11 >> (bVar5 & 0x3f)) & 0xff) * 4 +
                                       0x273550);
            uVar10 = (ulong)uVar9;
            uVar12 = (ulong)((uint)uVar12 ^
                            *(uint *)(lVar21 + (ulong)((uint)(uVar17 >> (bVar5 & 0x3f)) & 0xff) * 4
                                               + 0x273550));
            uVar18 = (ulong)((uint)uVar18 ^
                            *(uint *)(lVar21 + (ulong)((uint)(uVar8 >> (bVar5 & 0x3f)) & 0xff) * 4 +
                                               0x273550));
            zVar7 = zVar7 ^ *(uint *)(lVar21 + (ulong)((uint)((uVar15 ^ puVar6[3]) >> (bVar5 & 0x3f)
                                                             ) & 0xff) * 4 + 0x273550);
            uVar2 = (uint)uVar4 ^
                    *(uint *)(lVar21 + (ulong)((uint)(uVar19 >> (bVar5 & 0x3f)) & 0xff) * 4 +
                                       0x273550);
            uVar4 = (ulong)uVar2;
            bVar5 = bVar5 + 8;
            lVar21 = lVar21 + 0x400;
          } while (lVar21 != 0x1c00);
          puVar6 = puVar6 + 5;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
        buf = (uchar *)((long)buf + ((len / 0x28) * 5 + -5) * 8);
        uVar10 = (ulong)uVar2;
        uVar4 = (ulong)zVar7;
      }
      len = len % 0x28;
      uVar8 = (ulong)uVar9 ^ *(ulong *)buf;
      iVar16 = 8;
      do {
        uVar8 = (ulong)crc_table[uVar8 & 0xff] ^ uVar8 >> 8;
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
      uVar12 = uVar8 & 0xffffffff ^ uVar12 ^ *(ulong *)((long)buf + 8);
      iVar16 = 8;
      do {
        uVar12 = (ulong)crc_table[uVar12 & 0xff] ^ uVar12 >> 8;
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
      uVar18 = uVar12 & 0xffffffff ^ uVar18 ^ *(ulong *)((long)buf + 0x10);
      iVar16 = 8;
      do {
        uVar18 = (ulong)crc_table[uVar18 & 0xff] ^ uVar18 >> 8;
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
      uVar18 = uVar18 & 0xffffffff ^ uVar4 ^ *(ulong *)((long)buf + 0x18);
      iVar16 = 8;
      do {
        uVar18 = (ulong)crc_table[uVar18 & 0xff] ^ uVar18 >> 8;
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
      uVar10 = uVar18 & 0xffffffff ^ uVar10 ^ *(ulong *)((long)buf + 0x20);
      iVar16 = 8;
      do {
        uVar10 = (ulong)crc_table[uVar10 & 0xff] ^ uVar10 >> 8;
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
      buf = (uchar *)((long)buf + 0x28);
      uVar10 = uVar10 & 0xffffffff;
    }
    for (; 7 < len; len = len - 8) {
      uVar10 = (ulong)crc_table[(byte)((byte)uVar10 ^ (byte)*(ulong *)buf)] ^ uVar10 >> 8;
      uVar10 = (ulong)crc_table[(byte)((byte)uVar10 ^ *(byte *)((long)buf + 1))] ^ uVar10 >> 8;
      uVar10 = (ulong)crc_table[(byte)((byte)uVar10 ^ *(byte *)((long)buf + 2))] ^ uVar10 >> 8;
      uVar10 = (ulong)crc_table[(byte)((byte)uVar10 ^ *(byte *)((long)buf + 3))] ^ uVar10 >> 8;
      uVar10 = (ulong)crc_table[(byte)((byte)uVar10 ^ *(byte *)((long)buf + 4))] ^ uVar10 >> 8;
      uVar10 = (ulong)crc_table[(byte)((byte)uVar10 ^ *(byte *)((long)buf + 5))] ^ uVar10 >> 8;
      uVar10 = (ulong)crc_table[(byte)((byte)uVar10 ^ *(byte *)((long)buf + 6))] ^ uVar10 >> 8;
      pbVar1 = (byte *)((long)buf + 7);
      buf = (uchar *)((long)buf + 8);
      uVar10 = (ulong)crc_table[(byte)((byte)uVar10 ^ *pbVar1)] ^ uVar10 >> 8;
    }
    if (len != 0) {
      uVar18 = 0;
      do {
        uVar10 = (ulong)crc_table[(byte)((byte)uVar10 ^ *(byte *)((long)buf + uVar18))] ^
                 uVar10 >> 8;
        uVar18 = uVar18 + 1;
      } while (len != uVar18);
    }
    uVar13 = uVar10 ^ 0xffffffff;
  }
  return uVar13;
}

Assistant:

unsigned long ZEXPORT crc32_z(unsigned long crc, const unsigned char FAR *buf,
                              z_size_t len) {
    /* Return initial CRC, if requested. */
    if (buf == Z_NULL) return 0;

#ifdef DYNAMIC_CRC_TABLE
    once(&made, make_crc_table);
#endif /* DYNAMIC_CRC_TABLE */

    /* Pre-condition the CRC */
    crc = (~crc) & 0xffffffff;

#ifdef W

    /* If provided enough bytes, do a braided CRC calculation. */
    if (len >= N * W + W - 1) {
        z_size_t blks;
        z_word_t const *words;
        unsigned endian;
        int k;

        /* Compute the CRC up to a z_word_t boundary. */
        while (len && ((z_size_t)buf & (W - 1)) != 0) {
            len--;
            crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        }

        /* Compute the CRC on as many N z_word_t blocks as are available. */
        blks = len / (N * W);
        len -= blks * N * W;
        words = (z_word_t const *)buf;

        /* Do endian check at execution time instead of compile time, since ARM
           processors can change the endianness at execution time. If the
           compiler knows what the endianness will be, it can optimize out the
           check and the unused branch. */
        endian = 1;
        if (*(unsigned char *)&endian) {
            /* Little endian. */

            z_crc_t crc0;
            z_word_t word0;
#if N > 1
            z_crc_t crc1;
            z_word_t word1;
#if N > 2
            z_crc_t crc2;
            z_word_t word2;
#if N > 3
            z_crc_t crc3;
            z_word_t word3;
#if N > 4
            z_crc_t crc4;
            z_word_t word4;
#if N > 5
            z_crc_t crc5;
            z_word_t word5;
#endif
#endif
#endif
#endif
#endif

            /* Initialize the CRC for each braid. */
            crc0 = crc;
#if N > 1
            crc1 = 0;
#if N > 2
            crc2 = 0;
#if N > 3
            crc3 = 0;
#if N > 4
            crc4 = 0;
#if N > 5
            crc5 = 0;
#endif
#endif
#endif
#endif
#endif

            /*
              Process the first blks-1 blocks, computing the CRCs on each braid
              independently.
             */
            while (--blks) {
                /* Load the word for each braid into registers. */
                word0 = crc0 ^ words[0];
#if N > 1
                word1 = crc1 ^ words[1];
#if N > 2
                word2 = crc2 ^ words[2];
#if N > 3
                word3 = crc3 ^ words[3];
#if N > 4
                word4 = crc4 ^ words[4];
#if N > 5
                word5 = crc5 ^ words[5];
#endif
#endif
#endif
#endif
#endif
                words += N;

                /* Compute and update the CRC for each word. The loop should
                   get unrolled. */
                crc0 = crc_braid_table[0][word0 & 0xff];
#if N > 1
                crc1 = crc_braid_table[0][word1 & 0xff];
#if N > 2
                crc2 = crc_braid_table[0][word2 & 0xff];
#if N > 3
                crc3 = crc_braid_table[0][word3 & 0xff];
#if N > 4
                crc4 = crc_braid_table[0][word4 & 0xff];
#if N > 5
                crc5 = crc_braid_table[0][word5 & 0xff];
#endif
#endif
#endif
#endif
#endif
                for (k = 1; k < W; k++) {
                    crc0 ^= crc_braid_table[k][(word0 >> (k << 3)) & 0xff];
#if N > 1
                    crc1 ^= crc_braid_table[k][(word1 >> (k << 3)) & 0xff];
#if N > 2
                    crc2 ^= crc_braid_table[k][(word2 >> (k << 3)) & 0xff];
#if N > 3
                    crc3 ^= crc_braid_table[k][(word3 >> (k << 3)) & 0xff];
#if N > 4
                    crc4 ^= crc_braid_table[k][(word4 >> (k << 3)) & 0xff];
#if N > 5
                    crc5 ^= crc_braid_table[k][(word5 >> (k << 3)) & 0xff];
#endif
#endif
#endif
#endif
#endif
                }
            }

            /*
              Process the last block, combining the CRCs of the N braids at the
              same time.
             */
            crc = crc_word(crc0 ^ words[0]);
#if N > 1
            crc = crc_word(crc1 ^ words[1] ^ crc);
#if N > 2
            crc = crc_word(crc2 ^ words[2] ^ crc);
#if N > 3
            crc = crc_word(crc3 ^ words[3] ^ crc);
#if N > 4
            crc = crc_word(crc4 ^ words[4] ^ crc);
#if N > 5
            crc = crc_word(crc5 ^ words[5] ^ crc);
#endif
#endif
#endif
#endif
#endif
            words += N;
        }
        else {
            /* Big endian. */

            z_word_t crc0, word0, comb;
#if N > 1
            z_word_t crc1, word1;
#if N > 2
            z_word_t crc2, word2;
#if N > 3
            z_word_t crc3, word3;
#if N > 4
            z_word_t crc4, word4;
#if N > 5
            z_word_t crc5, word5;
#endif
#endif
#endif
#endif
#endif

            /* Initialize the CRC for each braid. */
            crc0 = byte_swap(crc);
#if N > 1
            crc1 = 0;
#if N > 2
            crc2 = 0;
#if N > 3
            crc3 = 0;
#if N > 4
            crc4 = 0;
#if N > 5
            crc5 = 0;
#endif
#endif
#endif
#endif
#endif

            /*
              Process the first blks-1 blocks, computing the CRCs on each braid
              independently.
             */
            while (--blks) {
                /* Load the word for each braid into registers. */
                word0 = crc0 ^ words[0];
#if N > 1
                word1 = crc1 ^ words[1];
#if N > 2
                word2 = crc2 ^ words[2];
#if N > 3
                word3 = crc3 ^ words[3];
#if N > 4
                word4 = crc4 ^ words[4];
#if N > 5
                word5 = crc5 ^ words[5];
#endif
#endif
#endif
#endif
#endif
                words += N;

                /* Compute and update the CRC for each word. The loop should
                   get unrolled. */
                crc0 = crc_braid_big_table[0][word0 & 0xff];
#if N > 1
                crc1 = crc_braid_big_table[0][word1 & 0xff];
#if N > 2
                crc2 = crc_braid_big_table[0][word2 & 0xff];
#if N > 3
                crc3 = crc_braid_big_table[0][word3 & 0xff];
#if N > 4
                crc4 = crc_braid_big_table[0][word4 & 0xff];
#if N > 5
                crc5 = crc_braid_big_table[0][word5 & 0xff];
#endif
#endif
#endif
#endif
#endif
                for (k = 1; k < W; k++) {
                    crc0 ^= crc_braid_big_table[k][(word0 >> (k << 3)) & 0xff];
#if N > 1
                    crc1 ^= crc_braid_big_table[k][(word1 >> (k << 3)) & 0xff];
#if N > 2
                    crc2 ^= crc_braid_big_table[k][(word2 >> (k << 3)) & 0xff];
#if N > 3
                    crc3 ^= crc_braid_big_table[k][(word3 >> (k << 3)) & 0xff];
#if N > 4
                    crc4 ^= crc_braid_big_table[k][(word4 >> (k << 3)) & 0xff];
#if N > 5
                    crc5 ^= crc_braid_big_table[k][(word5 >> (k << 3)) & 0xff];
#endif
#endif
#endif
#endif
#endif
                }
            }

            /*
              Process the last block, combining the CRCs of the N braids at the
              same time.
             */
            comb = crc_word_big(crc0 ^ words[0]);
#if N > 1
            comb = crc_word_big(crc1 ^ words[1] ^ comb);
#if N > 2
            comb = crc_word_big(crc2 ^ words[2] ^ comb);
#if N > 3
            comb = crc_word_big(crc3 ^ words[3] ^ comb);
#if N > 4
            comb = crc_word_big(crc4 ^ words[4] ^ comb);
#if N > 5
            comb = crc_word_big(crc5 ^ words[5] ^ comb);
#endif
#endif
#endif
#endif
#endif
            words += N;
            crc = byte_swap(comb);
        }

        /*
          Update the pointer to the remaining bytes to process.
         */
        buf = (unsigned char const *)words;
    }

#endif /* W */

    /* Complete the computation of the CRC on any remaining bytes. */
    while (len >= 8) {
        len -= 8;
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
    }
    while (len) {
        len--;
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
    }

    /* Return the CRC, post-conditioned. */
    return crc ^ 0xffffffff;
}